

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char> __thiscall
fmt::v11::detail::digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>
          (digit_grouping<char> *this,basic_appender<char> out,basic_string_view<char> digits)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  basic_appender<char> out_00;
  char *pcVar4;
  buffer<char> *in_RSI;
  long in_RDI;
  next_state nVar5;
  int sep_index;
  int i_1;
  int i;
  next_state state;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> separators;
  int num_digits;
  int in_stack_fffffffffffff728;
  make_unsigned_t<int> in_stack_fffffffffffff72c;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> *in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff754;
  digit_grouping<char> *in_stack_fffffffffffff758;
  basic_appender<char> local_888;
  buffer<char> *local_880;
  buffer<char> *local_878;
  int local_86c;
  int local_868;
  int local_864;
  char *local_860;
  int local_858;
  char *local_850;
  int local_848;
  undefined4 local_830;
  buffer<int> local_828 [63];
  int local_2c;
  basic_string_view<char> local_20;
  basic_appender<char> local_10;
  buffer<char> *local_8;
  
  local_10.container = in_RSI;
  sVar2 = basic_string_view<char>::size(&local_20);
  local_2c = (int)sVar2;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_>::basic_memory_buffer
            (in_stack_fffffffffffff730,
             (allocator<int> *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  local_830 = 0;
  buffer<int>::push_back
            (&in_stack_fffffffffffff730->super_buffer<int>,
             (int *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  nVar5 = initial_state((digit_grouping<char> *)0x2ab7bb);
  local_860 = (char *)nVar5.group._M_current;
  local_858 = nVar5.pos;
  local_850 = local_860;
  local_848 = local_858;
  while ((local_864 = next(in_stack_fffffffffffff758,
                           (next_state *)
                           CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750)),
         local_864 != 0 && (local_864 < local_2c))) {
    buffer<int>::push_back
              (&in_stack_fffffffffffff730->super_buffer<int>,
               (int *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  }
  local_868 = 0;
  sVar2 = buffer<int>::size(local_828);
  local_86c = (int)sVar2 + -1;
  for (; local_868 < local_2c; local_868 = local_868 + 1) {
    iVar1 = local_2c - local_868;
    piVar3 = buffer<int>::operator[]<int>(local_828,local_86c);
    if (iVar1 == *piVar3) {
      in_stack_fffffffffffff730 =
           (basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> *)(in_RDI + 0x20);
      std::__cxx11::string::data();
      out_00.container = (buffer<char> *)std::__cxx11::string::data();
      std::__cxx11::string::size();
      local_880 = local_10.container;
      local_878 = (buffer<char> *)
                  copy<char,_const_char_*,_fmt::v11::basic_appender<char>,_0>
                            ((char *)in_stack_fffffffffffff730,
                             (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                             out_00);
      local_86c = local_86c + -1;
      local_10 = (basic_appender<char>)local_878;
    }
    in_stack_fffffffffffff72c = to_unsigned<int>(0);
    pcVar4 = basic_string_view<char>::operator[](&local_20,(ulong)in_stack_fffffffffffff72c);
    in_stack_fffffffffffff728 = (int)*pcVar4;
    local_888 = basic_appender<char>::operator++(&local_10,0);
    basic_appender<char>::operator*(&local_888);
    basic_appender<char>::operator=
              ((basic_appender<char> *)in_stack_fffffffffffff730,
               (char)(in_stack_fffffffffffff72c >> 0x18));
  }
  local_8 = local_10.container;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_>::~basic_memory_buffer
            ((basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> *)0x2ab9ba);
  return (basic_appender<char>)local_8;
}

Assistant:

auto apply(Out out, basic_string_view<C> digits) const -> Out {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out = copy<Char>(thousands_sep_.data(),
                         thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }